

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void * mwRealloc(void *p,size_t size,char *file,int line)

{
  mwData *mw;
  char cVar1;
  int iVar2;
  void *pvVar3;
  mwData *pmVar4;
  void *__dest;
  int *piVar5;
  long lVar6;
  
  if (mwInited == 0) {
    mwUseAtexit = 1;
    mwInit();
  }
  if (p == (void *)0x0) {
    pvVar3 = mwMalloc(size,file,line);
    return pvVar3;
  }
  if (size == 0) {
    mwFree(p,file,line);
    return (void *)0x0;
  }
  pvVar3 = (void *)((long)p + -0x38);
  if (mwDataSize == '\0') {
    pvVar3 = p;
  }
  mw = (mwData *)((long)pvVar3 + -8);
  iVar2 = mwIsOwned(mw,file,line);
  cVar1 = mwUseLimit;
  if (iVar2 != 0) {
    if ((*(byte *)((long)pvVar3 + 0x2c) & 1) == 0) {
      if ((mwUseLimit != '\x01') ||
         (lVar6 = *(long *)((long)pvVar3 + 0x20),
         (long)((mwStatCurAlloc + size) - lVar6) <= mwAllocLimit)) {
        mwUseLimit = 0;
        __dest = mwMalloc(size,file,line);
        if (__dest == (void *)0x0) {
          mwUseLimit = cVar1;
          return (void *)0x0;
        }
        if (*(ulong *)((long)pvVar3 + 0x20) < size) {
          size = *(ulong *)((long)pvVar3 + 0x20);
        }
        memcpy(__dest,p,size);
        mwFree(p,file,line);
        mwUseLimit = cVar1;
        return __dest;
      }
      if (mwTestAlways != 0) {
        mwTestNow(file,line,1);
        lVar6 = *(long *)((long)pvVar3 + 0x20);
      }
      mwCounter = mwCounter + 1;
      mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",mwCounter,file,
              (ulong)(uint)line,size - lVar6,mwAllocLimit - mwStatCurAlloc);
      mwErrors = mwErrors + 1;
      iVar2 = mwFlushR();
      mwFlushingB2 = iVar2 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      goto LAB_00107d15;
    }
    mwErrors = mwErrors + 1;
    iVar2 = mwFlushR();
    mwFlushingB2 = iVar2 + 1;
    mwFlushingB1 = mwFlushingB2;
    mwFlushing = mwFlushingB2;
    mwFlush();
    pmVar4 = (mwData *)((long)pvVar3 + 0x30);
    if (mwDataSize == '\0') {
      pmVar4 = mw;
    }
    if (*(char *)&pmVar4->next != -4) {
      mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",mwCounter,file,
              (ulong)(uint)line,mw);
    }
  }
  piVar5 = mwLFline;
  lVar6 = 0;
  do {
    if (*(void **)((long)mwLastFree + lVar6) == p) {
      mwErrors = mwErrors + 1;
      iVar2 = mwFlushR();
      mwFlushingB2 = iVar2 + 1;
      mwFlushingB1 = mwFlushingB2;
      mwFlushing = mwFlushingB2;
      mwFlush();
      mwWrite("realloc: <%ld> %s(%d), %p was freed from %s(%d)\n",mwCounter,file,(ulong)(uint)line,p
              ,*(undefined8 *)((long)mwLFfile + lVar6),*piVar5);
      goto LAB_00107d15;
    }
    lVar6 = lVar6 + 8;
    piVar5 = piVar5 + 1;
  } while (lVar6 != 0x200);
  mwErrors = mwErrors + 1;
  iVar2 = mwFlushR();
  mwFlushingB2 = iVar2 + 1;
  mwFlushingB1 = mwFlushingB2;
  mwFlushing = mwFlushingB2;
  mwFlush();
  mwWrite("realloc: <%ld> %s(%d), unknown pointer %p\n",mwCounter,file,(ulong)(uint)line,p);
LAB_00107d15:
  mwFlush();
  return (void *)0x0;
}

Assistant:

void *mwRealloc(void *p, size_t size, const char *file, int line)
{
	int oldUseLimit, i;
	mwData *mw;
	char *ptr;

	mwAutoInit();

	if (p == NULL) {
		return mwMalloc(size, file, line);
	}
	if (size == 0) {
		mwFree(p, file, line);
		return NULL;
	}

	MW_MUTEX_LOCK();

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);
	if (mwIsOwned(mw, file, line)) {

		/* if the buffer is an NML, treat this as a double-free */
		if (mw->flag & MW_NML) {
			mwIncErr();
			if (*((unsigned char *)(mw) + mwDataSize + mwOverflowZoneSize) != MW_VAL_NML) {
				mwWrite("internal: <%ld> %s(%d), no-mans-land MW-%p is corrupted\n",
						mwCounter, file, line, mw);
			}
			goto check_dbl_free;
		}

		/* if this allocation would violate the limit, fail it */
		if (mwUseLimit && ((long)size + mwStatCurAlloc - (long)mw->size > mwAllocLimit)) {
			TESTS(file, line);
			mwCounter ++;
			mwWrite("limit fail: <%ld> %s(%d), %ld wanted %ld available\n",
					mwCounter, file, line, (unsigned long)size - mw->size, mwAllocLimit - mwStatCurAlloc);
			mwIncErr();
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}

		/* fake realloc operation */
		oldUseLimit = mwUseLimit;
		mwUseLimit = 0;
		ptr = (char *) mwMalloc(size, file, line);
		if (ptr != NULL) {
			if (size < mw->size) {
				memcpy(ptr, p, size);
			} else {
				memcpy(ptr, p, mw->size);
			}
			mwFree(p, file, line);
		}
		mwUseLimit = oldUseLimit;
		MW_MUTEX_UNLOCK();
		return (void *) ptr;
	}

	/* Unknown pointer! */

	/* using free'd pointer? */
check_dbl_free:
	for (i = 0; i < MW_FREE_LIST; i++) {
		if (mwLastFree[i] == p) {
			mwIncErr();
			mwWrite("realloc: <%ld> %s(%d), %p was"
					" freed from %s(%d)\n",
					mwCounter, file, line, p,
					mwLFfile[i], mwLFline[i]);
			FLUSH();
			MW_MUTEX_UNLOCK();
			return NULL;
		}
	}

	/* some weird pointer */
	mwIncErr();
	mwWrite("realloc: <%ld> %s(%d), unknown pointer %p\n",
			mwCounter, file, line, p);
	FLUSH();
	MW_MUTEX_UNLOCK();
	return NULL;
}